

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall
CompareBoundaryRelation::WedgesCross
          (CompareBoundaryRelation *this,S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,
          S2Point *b2)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  
  this->found_shared_vertex_ = true;
  bVar1 = WedgeContainsSemiwedge(a0,ab1,a2,b2,this->reverse_b_);
  if (bVar1) {
    this->contains_edge_ = true;
    bVar2 = this->excludes_edge_;
    bVar3 = 1;
  }
  else {
    this->excludes_edge_ = true;
    bVar3 = this->contains_edge_;
    bVar2 = 1;
  }
  return (bVar2 & bVar3) != 0;
}

Assistant:

bool WedgesCross(const S2Point& a0, const S2Point& ab1, const S2Point& a2,
                   const S2Point& b0, const S2Point& b2) override {
    // Because we don't care about the interior of B, only its boundary, it is
    // sufficient to check whether A contains the semiwedge (ab1, b2).
    found_shared_vertex_ = true;
    if (WedgeContainsSemiwedge(a0, ab1, a2, b2, reverse_b_)) {
      contains_edge_ = true;
    } else {
      excludes_edge_ = true;
    }
    return contains_edge_ & excludes_edge_;
  }